

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFtpCommand.cpp
# Opt level: O3

int __thiscall CRETRCommand::doWhat(CRETRCommand *this,CClient *pClient)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  EFTPSTATE EVar2;
  int iVar3;
  FILE *pFVar4;
  long lVar5;
  size_t sVar6;
  long *plVar7;
  CPasvDataTransfer *pCVar8;
  CPortDataTransfer *this_00;
  ulong *puVar9;
  string ip;
  string msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string ret;
  char buffer [4096];
  string local_10b8;
  string local_1098;
  undefined1 *local_1078 [2];
  undefined1 local_1068 [16];
  string local_1058;
  string local_1038 [128];
  
  EVar2 = CClient::GetClientState(pClient);
  if (EVar2 == PASV) {
    local_1098._M_dataplus._M_p = (pointer)&local_1098.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1098,"SENDFILE#","");
    CClient::GetUserDir_abi_cxx11_(local_1038,pClient);
    iVar3 = chdir(local_1038[0]._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1038[0]._M_dataplus._M_p != &local_1038[0].field_2) {
      operator_delete(local_1038[0]._M_dataplus._M_p);
    }
    if (iVar3 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Current user dir is error,now program will exit.",0x30);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
LAB_00108916:
      exit(-1);
    }
    pFVar4 = fopen((this->super_CCommand).m_Args._M_dataplus._M_p,"rb");
    if (pFVar4 != (FILE *)0x0) {
      fseek(pFVar4,0,2);
      lVar5 = ftell(pFVar4);
      fclose(pFVar4);
      bzero(local_1038,0x1000);
      sprintf((char *)local_1038,"150 Opening BINARY mode data connection for %s (%ld bytes).\r\n",
              (this->super_CCommand).m_Args._M_dataplus._M_p,lVar5);
      local_1058._M_dataplus._M_p = (pointer)&local_1058.field_2;
      sVar6 = strlen((char *)local_1038);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1058,local_1038,(long)&local_1038[0]._M_dataplus._M_p + sVar6);
      CClient::sendMsg(pClient,&local_1058);
      CClient::GetUserDir_abi_cxx11_(&local_10b8,pClient);
      std::__cxx11::string::_M_append((char *)&local_1098,(ulong)local_10b8._M_dataplus._M_p);
      paVar1 = &local_10b8.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_10b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_10b8._M_dataplus._M_p);
      }
      local_1078[0] = local_1068;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1078,local_1098._M_dataplus._M_p,
                 local_1098._M_dataplus._M_p + local_1098._M_string_length);
      std::__cxx11::string::append((char *)local_1078);
      plVar7 = (long *)std::__cxx11::string::_M_append
                                 ((char *)local_1078,
                                  (ulong)(this->super_CCommand).m_Args._M_dataplus._M_p);
      puVar9 = (ulong *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar9) {
        local_10b8.field_2._M_allocated_capacity = *puVar9;
        local_10b8.field_2._8_8_ = plVar7[3];
        local_10b8._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_10b8.field_2._M_allocated_capacity = *puVar9;
        local_10b8._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_10b8._M_string_length = plVar7[1];
      *plVar7 = (long)puVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_1098,(string *)&local_10b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_10b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_10b8._M_dataplus._M_p);
      }
      if (local_1078[0] != local_1068) {
        operator_delete(local_1078[0]);
      }
      pCVar8 = CClient::SetClientPasvDataTransfer(pClient);
      CPasvDataTransfer::SetMsg(pCVar8,&local_1098);
      pCVar8 = CClient::SetClientPasvDataTransfer(pClient);
      CClient::GetClientfd(pClient);
      CPasvDataTransfer::SetControlSock(pCVar8);
      pCVar8 = CClient::SetClientPasvDataTransfer(pClient);
      CPasvDataTransfer::SetControlSock(pCVar8);
      CClient::SetClientState(pClient,PASS);
      CClient::SetClientPasvDataTransfer(pClient);
LAB_00108895:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1058._M_dataplus._M_p != &local_1058.field_2) {
        operator_delete(local_1058._M_dataplus._M_p);
      }
      iVar3 = 1;
      goto LAB_001088a9;
    }
    local_1038[0]._M_dataplus._M_p = (pointer)&local_1038[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1038,"550 Failed to open file.\r\n","");
    CClient::sendMsg(pClient,local_1038);
  }
  else {
    EVar2 = CClient::GetClientState(pClient);
    if (EVar2 != PORT) {
      local_1038[0]._M_dataplus._M_p = (pointer)&local_1038[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1038,"425 Use PORT or PASV first.\r\n","");
      CClient::sendMsg(pClient,local_1038);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1038[0]._M_dataplus._M_p != &local_1038[0].field_2) {
        operator_delete(local_1038[0]._M_dataplus._M_p);
      }
      return -1;
    }
    local_1098._M_dataplus._M_p = (pointer)&local_1098.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1098,"SENDFILE#","");
    CClient::GetUserDir_abi_cxx11_(local_1038,pClient);
    iVar3 = chdir(local_1038[0]._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1038[0]._M_dataplus._M_p != &local_1038[0].field_2) {
      operator_delete(local_1038[0]._M_dataplus._M_p);
    }
    if (iVar3 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Current user dir is error,now program will exit.",0x30);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      goto LAB_00108916;
    }
    pFVar4 = fopen((this->super_CCommand).m_Args._M_dataplus._M_p,"rb");
    if (pFVar4 != (FILE *)0x0) {
      fseek(pFVar4,0,2);
      lVar5 = ftell(pFVar4);
      fclose(pFVar4);
      bzero(local_1038,0x1000);
      sprintf((char *)local_1038,"150 Opening BINARY mode data connection for %s (%ld bytes).\r\n",
              (this->super_CCommand).m_Args._M_dataplus._M_p,lVar5);
      local_1058._M_dataplus._M_p = (pointer)&local_1058.field_2;
      sVar6 = strlen((char *)local_1038);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1058,local_1038,(long)&local_1038[0]._M_dataplus._M_p + sVar6);
      CClient::sendMsg(pClient,&local_1058);
      CClient::GetUserDir_abi_cxx11_(&local_10b8,pClient);
      std::__cxx11::string::_M_append((char *)&local_1098,(ulong)local_10b8._M_dataplus._M_p);
      paVar1 = &local_10b8.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_10b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_10b8._M_dataplus._M_p);
      }
      local_1078[0] = local_1068;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1078,local_1098._M_dataplus._M_p,
                 local_1098._M_dataplus._M_p + local_1098._M_string_length);
      std::__cxx11::string::append((char *)local_1078);
      plVar7 = (long *)std::__cxx11::string::_M_append
                                 ((char *)local_1078,
                                  (ulong)(this->super_CCommand).m_Args._M_dataplus._M_p);
      puVar9 = (ulong *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar9) {
        local_10b8.field_2._M_allocated_capacity = *puVar9;
        local_10b8.field_2._8_8_ = plVar7[3];
        local_10b8._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_10b8.field_2._M_allocated_capacity = *puVar9;
        local_10b8._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_10b8._M_string_length = plVar7[1];
      *plVar7 = (long)puVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_1098,(string *)&local_10b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_10b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_10b8._M_dataplus._M_p);
      }
      if (local_1078[0] != local_1068) {
        operator_delete(local_1078[0]);
      }
      local_10b8._M_string_length = 0;
      local_10b8.field_2._M_allocated_capacity =
           local_10b8.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_10b8._M_dataplus._M_p = (pointer)paVar1;
      iVar3 = CClient::GetClientPortIpAndPort(pClient,&local_10b8);
      this_00 = (CPortDataTransfer *)operator_new(0x60);
      CPortDataTransfer::CPortDataTransfer(this_00,&local_10b8,iVar3);
      CPortDataTransfer::SetMsg(this_00,&local_1098);
      iVar3 = CClient::GetClientfd(pClient);
      CPortDataTransfer::SetControlSock(this_00,iVar3);
      CThread::Run((CThread *)this_00);
      CClient::SetClientState(pClient,PASS);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_10b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_10b8._M_dataplus._M_p);
      }
      goto LAB_00108895;
    }
    local_1038[0]._M_dataplus._M_p = (pointer)&local_1038[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1038,"550 Failed to open file.\r\n","");
    CClient::sendMsg(pClient,local_1038);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1038[0]._M_dataplus._M_p != &local_1038[0].field_2) {
    operator_delete(local_1038[0]._M_dataplus._M_p);
  }
  iVar3 = -1;
LAB_001088a9:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1098._M_dataplus._M_p != &local_1098.field_2) {
    operator_delete(local_1098._M_dataplus._M_p);
  }
  return iVar3;
}

Assistant:

int CRETRCommand::doWhat(CClient *pClient){
    if(pClient->GetClientState() == PASV){
        string msg = "SENDFILE#";
        int r = chdir(pClient->GetUserDir().c_str());
        if(r == 0){
            FILE *file = fopen(m_Args.c_str(),"rb");
            if(file != NULL){
                fseek(file,0,2);
                long len = ftell(file);
                fclose(file);
                char buffer[BUFFER_SIZE];
                bzero(buffer,BUFFER_SIZE);
                sprintf(buffer,"150 Opening BINARY mode data connection for %s (%ld bytes).\r\n",
                        m_Args.c_str(),len);

                string ret(buffer);
                pClient->sendMsg(ret);

                msg += pClient->GetUserDir();
                msg = msg + "#" + m_Args;
                pClient->GetClientPasvDataTransfer()->SetMsg(msg);
                pClient->GetClientPasvDataTransfer()->SetControlSock(pClient->GetClientfd());
                pClient->GetClientPasvDataTransfer()->PostSignal();

                pClient->SetClientState(PASS);
                pClient->SetClientPasvDataTransfer(NULL);
                return 1;
            }
            else{
                string ret = "550 Failed to open file.\r\n";
                pClient->sendMsg(ret);
                return -1;
            }
        }
        else{
            cout << "Current user dir is error,now program will exit." << endl;
            exit(-1);
        }
    }
    else if(pClient->GetClientState() == PORT){
        string msg = "SENDFILE#";
        int r = chdir(pClient->GetUserDir().c_str());
        if(r == 0){
            FILE *file = fopen(m_Args.c_str(),"rb");
            if(file != NULL){
                fseek(file,0,2);
                long len = ftell(file);
                fclose(file);
                char buffer[BUFFER_SIZE];
                bzero(buffer,BUFFER_SIZE);
                sprintf(buffer,"150 Opening BINARY mode data connection for %s (%ld bytes).\r\n",
                        m_Args.c_str(),len);

                string ret(buffer);
                pClient->sendMsg(ret);

                msg += pClient->GetUserDir();
                msg = msg + "#" + m_Args;
                string ip;
                int port;

                port = pClient->GetClientPortIpAndPort(ip);

                CPortDataTransfer *c = new CPortDataTransfer(ip,port);
                c->SetMsg(msg);
                c->SetControlSock(pClient->GetClientfd());
                c->Run();

                pClient->SetClientState(PASS);
                return 1;
            }
            else{
                string ret = "550 Failed to open file.\r\n";
                pClient->sendMsg(ret);
                return -1;
            }
        }
        else{
            cout << "Current user dir is error,now program will exit." << endl;
            exit(-1);
        }
    }
    else{
        string ret = "425 Use PORT or PASV first.\r\n";
        pClient->sendMsg(ret);
        return -1;
    }
}